

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_user_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  undefined1 *puVar1;
  Curl_easy *data;
  char *pcVar2;
  CURLcode CVar3;
  char *pcVar4;
  anon_union_240_10_26c073a1_for_proto *pp;
  
  data = conn->data;
  pp = &conn->proto;
  if ((ftpcode == 0x14b) && ((conn->proto).ftpc.state == FTP_USER)) {
    pcVar2 = *(char **)((long)(data->req).protop + 8);
    pcVar4 = "";
    if (pcVar2 != (char *)0x0) {
      pcVar4 = pcVar2;
    }
    CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"PASS %s",pcVar4);
    if (CVar3 == CURLE_OK) {
      (conn->proto).ftpc.state = FTP_PASS;
      CVar3 = CURLE_OK;
    }
  }
  else {
    if (ftpcode - 200U < 100) {
      CVar3 = ftp_state_loggedin(conn);
      return CVar3;
    }
    if (ftpcode == 0x14c) {
      if ((data->set).str[10] != (char *)0x0) {
        CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"ACCT %s");
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        (conn->proto).ftpc.state = FTP_ACCT;
        return CURLE_OK;
      }
      Curl_failf(data,"ACCT requested but none available");
    }
    else {
      if (((data->set).str[0xb] != (char *)0x0) && (((data->state).field_0x4e4 & 0x40) == 0)) {
        CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"%s");
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        puVar1 = &(conn->data->state).field_0x4e4;
        *(ushort *)puVar1 = *(ushort *)puVar1 | 0x40;
        (conn->proto).ftpc.state = FTP_USER;
        return CURLE_OK;
      }
      Curl_failf(data,"Access denied: %03d",ftpcode);
    }
    CVar3 = CURLE_LOGIN_DENIED;
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_state_user_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  (void)instate; /* no use for this yet */

  /* some need password anyway, and others just return 2xx ignored */
  if((ftpcode == 331) && (ftpc->state == FTP_USER)) {
    /* 331 Password required for ...
       (the server requires to send the user's password too) */
    PPSENDF(&ftpc->pp, "PASS %s", ftp->passwd?ftp->passwd:"");
    state(conn, FTP_PASS);
  }
  else if(ftpcode/100 == 2) {
    /* 230 User ... logged in.
       (the user logged in with or without password) */
    result = ftp_state_loggedin(conn);
  }
  else if(ftpcode == 332) {
    if(data->set.str[STRING_FTP_ACCOUNT]) {
      PPSENDF(&ftpc->pp, "ACCT %s", data->set.str[STRING_FTP_ACCOUNT]);
      state(conn, FTP_ACCT);
    }
    else {
      failf(data, "ACCT requested but none available");
      result = CURLE_LOGIN_DENIED;
    }
  }
  else {
    /* All other response codes, like:

    530 User ... access denied
    (the server denies to log the specified user) */

    if(conn->data->set.str[STRING_FTP_ALTERNATIVE_TO_USER] &&
        !conn->data->state.ftp_trying_alternative) {
      /* Ok, USER failed.  Let's try the supplied command. */
      PPSENDF(&conn->proto.ftpc.pp, "%s",
              conn->data->set.str[STRING_FTP_ALTERNATIVE_TO_USER]);
      conn->data->state.ftp_trying_alternative = TRUE;
      state(conn, FTP_USER);
      result = CURLE_OK;
    }
    else {
      failf(data, "Access denied: %03d", ftpcode);
      result = CURLE_LOGIN_DENIED;
    }
  }
  return result;
}